

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::AddWithoutInterpreting
          (OptionInterpreter *this,UninterpretedOption *uninterpreted_option,Message *options)

{
  int iVar1;
  undefined4 extraout_var;
  FieldDescriptor *pFVar2;
  LogMessage *other;
  undefined4 extraout_var_00;
  long *plVar3;
  allocator<char> local_59;
  LogMessage local_58;
  
  iVar1 = (*(options->super_MessageLite)._vptr_MessageLite[0x13])(options);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"uninterpreted_option",&local_59);
  pFVar2 = Descriptor::FindFieldByName
                     ((Descriptor *)CONCAT44(extraout_var,iVar1),(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  if (pFVar2 == (FieldDescriptor *)0x0) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.cc"
               ,0x118f);
    other = internal::LogMessage::operator<<(&local_58,"CHECK failed: field != NULL: ");
    internal::LogFinisher::operator=((LogFinisher *)&local_59,other);
    internal::LogMessage::~LogMessage(&local_58);
  }
  iVar1 = (*(options->super_MessageLite)._vptr_MessageLite[0x12])(options);
  plVar3 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x208))
                             ((long *)CONCAT44(extraout_var_00,iVar1),options,pFVar2,0);
  (**(code **)(*plVar3 + 0x68))(plVar3,uninterpreted_option);
  return;
}

Assistant:

void DescriptorBuilder::OptionInterpreter::AddWithoutInterpreting(
    const UninterpretedOption& uninterpreted_option, Message* options) {
  const FieldDescriptor* field =
    options->GetDescriptor()->FindFieldByName("uninterpreted_option");
  GOOGLE_CHECK(field != NULL);

  options->GetReflection()->AddMessage(options, field)
    ->CopyFrom(uninterpreted_option);
}